

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.cpp
# Opt level: O2

bool __thiscall MeCab::Param::load(Param *this,char *filename)

{
  allocator local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  ifstream ifs;
  
  std::ifstream::ifstream(&ifs,filename,_S_in);
  std::__cxx11::string::string((string *)&local_230,"800",&local_231);
  set<std::__cxx11::string>(this,"cost-factor",&local_230,false);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_230,"BOS/EOS,*,*,*,*,*,*,*,*",&local_231);
  set<std::__cxx11::string>(this,"bos-feature",&local_230,false);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_230,"8",&local_231);
  set<std::__cxx11::string>(this,"eval-size",&local_230,false);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_230,"4",&local_231);
  set<std::__cxx11::string>(this,"unk-eval-size",&local_230,false);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_230,"%pS%f[7]",&local_231);
  set<std::__cxx11::string>(this,"node-format-yomi",&local_230,false);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_230,"%M",&local_231);
  set<std::__cxx11::string>(this,"unk-format-yomi",&local_230,false);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_230,"\n",&local_231);
  set<std::__cxx11::string>(this,"eos-format-yomi",&local_230,false);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_230,"%m\t%F-[0,1,2,3]\n",&local_231);
  set<std::__cxx11::string>(this,"node-format-simple",&local_230,false);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_230,"EOS\n",&local_231);
  set<std::__cxx11::string>(this,"eos-format-simple",&local_230,false);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string
            ((string *)&local_230,"%m\t%f[7]\t%f[6]\t%F-[0,1,2,3]\t%f[4]\t%f[5]\n",&local_231);
  set<std::__cxx11::string>(this,"node-format-chasen",&local_230,false);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_230,"%m\t%m\t%m\t%F-[0,1,2,3]\t\t\n",&local_231);
  set<std::__cxx11::string>(this,"unk-format-chasen",&local_230,false);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_230,"EOS\n",&local_231);
  set<std::__cxx11::string>(this,"eos-format-chasen",&local_230,false);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string
            ((string *)&local_230,"%M\t%f[7]\t%f[6]\t%F-[0,1,2,3]\t%f[4]\t%f[5]\n",&local_231);
  set<std::__cxx11::string>(this,"node-format-chasen2",&local_230,false);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_230,"%M\t%m\t%m\t%F-[0,1,2,3]\t\t\n",&local_231);
  set<std::__cxx11::string>(this,"unk-format-chasen2",&local_230,false);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_230,"EOS\n",&local_231);
  set<std::__cxx11::string>(this,"eos-format-chasen2",&local_230,false);
  std::__cxx11::string::~string((string *)&local_230);
  std::ifstream::~ifstream(&ifs);
  return true;
}

Assistant:

bool Param::load(const char *filename) {
  std::ifstream ifs(WPATH(filename));

  /* for Open JTalk
  CHECK_FALSE(ifs) << "no such file or directory: " << filename;

  std::string line;
  while (std::getline(ifs, line)) {
    if (!line.size() ||
        (line.size() && (line[0] == ';' || line[0] == '#'))) continue;

    size_t pos = line.find('=');
    CHECK_FALSE(pos != std::string::npos) << "format error: " << line;

    size_t s1, s2;
    for (s1 = pos+1; s1 < line.size() && isspace(line[s1]); s1++);
    for (s2 = pos-1; static_cast<long>(s2) >= 0 && isspace(line[s2]); s2--);
    const std::string value = line.substr(s1, line.size() - s1);
    const std::string key   = line.substr(0, s2 + 1);
    set<std::string>(key.c_str(), value, false);
  }
  */
  set<std::string>("cost-factor","800",false);
  set<std::string>("bos-feature","BOS/EOS,*,*,*,*,*,*,*,*",false);
  set<std::string>("eval-size","8",false);
  set<std::string>("unk-eval-size","4",false);
  set<std::string>("node-format-yomi","%pS%f[7]",false);
  set<std::string>("unk-format-yomi","%M",false);
  set<std::string>("eos-format-yomi","\n",false);
  set<std::string>("node-format-simple","%m\t%F-[0,1,2,3]\n",false);
  set<std::string>("eos-format-simple","EOS\n",false);
  set<std::string>("node-format-chasen","%m\t%f[7]\t%f[6]\t%F-[0,1,2,3]\t%f[4]\t%f[5]\n",false);
  set<std::string>("unk-format-chasen","%m\t%m\t%m\t%F-[0,1,2,3]\t\t\n",false);
  set<std::string>("eos-format-chasen","EOS\n",false);
  set<std::string>("node-format-chasen2","%M\t%f[7]\t%f[6]\t%F-[0,1,2,3]\t%f[4]\t%f[5]\n",false);
  set<std::string>("unk-format-chasen2","%M\t%m\t%m\t%F-[0,1,2,3]\t\t\n",false);
  set<std::string>("eos-format-chasen2","EOS\n",false);

  return true;
}